

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void __thiscall chrono::ChContactContainerNSC::RemoveAllContacts(ChContactContainerNSC *this)

{
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>*>>
            (&this->contactlist_6_6,&this->lastcontact_6_6,&this->n_added_6_6);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>*>>
            (&this->contactlist_6_3,&this->lastcontact_6_3,&this->n_added_6_3);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>*>>
            (&this->contactlist_3_3,&this->lastcontact_3_3,&this->n_added_3_3);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>*>>
            (&this->contactlist_333_3,&this->lastcontact_333_3,&this->n_added_333_3);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>*>>
            (&this->contactlist_333_6,&this->lastcontact_333_6,&this->n_added_333_6);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>*>>
            (&this->contactlist_333_333,&this->lastcontact_333_333,&this->n_added_333_333);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>*>>
            (&this->contactlist_666_3,&this->lastcontact_666_3,&this->n_added_666_3);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>*>>
            (&this->contactlist_666_6,&this->lastcontact_666_6,&this->n_added_666_6);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>*>>
            (&this->contactlist_666_333,&this->lastcontact_666_333,&this->n_added_666_333);
  _RemoveAllContacts<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>*>>
            (&this->contactlist_666_666,&this->lastcontact_666_666,&this->n_added_666_666);
  _RemoveAllContacts<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>,std::_List_iterator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>*>>
            (&this->contactlist_6_6_rolling,&this->lastcontact_6_6_rolling,
             &this->n_added_6_6_rolling);
  return;
}

Assistant:

void ChContactContainerNSC::RemoveAllContacts() {
    _RemoveAllContacts(contactlist_6_6, lastcontact_6_6, n_added_6_6);
    _RemoveAllContacts(contactlist_6_3, lastcontact_6_3, n_added_6_3);
    _RemoveAllContacts(contactlist_3_3, lastcontact_3_3, n_added_3_3);
    _RemoveAllContacts(contactlist_333_3, lastcontact_333_3, n_added_333_3);
    _RemoveAllContacts(contactlist_333_6, lastcontact_333_6, n_added_333_6);
    _RemoveAllContacts(contactlist_333_333, lastcontact_333_333, n_added_333_333);
    _RemoveAllContacts(contactlist_666_3, lastcontact_666_3, n_added_666_3);
    _RemoveAllContacts(contactlist_666_6, lastcontact_666_6, n_added_666_6);
    _RemoveAllContacts(contactlist_666_333, lastcontact_666_333, n_added_666_333);
    _RemoveAllContacts(contactlist_666_666, lastcontact_666_666, n_added_666_666);
    _RemoveAllContacts(contactlist_6_6_rolling, lastcontact_6_6_rolling, n_added_6_6_rolling);
}